

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O3

void arm::display_shift(ostream *o,RegisterShiftKind shift)

{
  if (shift < (Rrx|Lsl)) {
    std::__ostream_insert<char,std::char_traits<char>>
              (o,&DAT_001ba53c + *(int *)(&DAT_001ba53c + (ulong)shift * 4),3);
    return;
  }
  return;
}

Assistant:

void display_shift(std::ostream &o, RegisterShiftKind shift) {
  switch (shift) {
    case RegisterShiftKind::Lsl:
      o << "LSL";
      break;
    case RegisterShiftKind::Lsr:
      o << "LSR";
      break;
    case RegisterShiftKind::Asr:
      o << "ASR";
      break;
    case RegisterShiftKind::Ror:
      o << "ROR";
      break;
    case RegisterShiftKind::Rrx:
      o << "RRX";
      break;
  }
}